

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O0

void __thiscall
irr::gui::IGUIElement::IGUIElement
          (IGUIElement *this,void **vtt,EGUI_ELEMENT_TYPE type,IGUIEnvironment *environment,
          IGUIElement *parent,s32 id,rect<int> *rectangle)

{
  IGUIElement *in_RCX;
  undefined4 in_EDX;
  rect<float> *in_RSI;
  IEventReceiver *in_RDI;
  IGUIElement *in_R8;
  undefined4 in_R9D;
  undefined8 *in_stack_00000008;
  uint local_3c [5];
  
  local_3c[4] = in_R9D;
  IEventReceiver::IEventReceiver(in_RDI);
  in_RDI->_vptr_IEventReceiver = (_func_int **)in_RSI->UpperLeftCorner;
  *(vector2d<float> *)(in_RDI->_vptr_IEventReceiver[-3] + (long)&in_RDI->_vptr_IEventReceiver) =
       in_RSI->LowerRightCorner;
  ::std::__cxx11::list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_>::list
            ((list<irr::gui::IGUIElement_*,_std::allocator<irr::gui::IGUIElement_*>_> *)0x39e507);
  in_RDI[4]._vptr_IEventReceiver = (_func_int **)0x0;
  ::std::_List_iterator<irr::gui::IGUIElement_*>::_List_iterator
            ((_List_iterator<irr::gui::IGUIElement_*> *)(in_RDI + 5));
  in_RDI[6]._vptr_IEventReceiver = (_func_int **)*in_stack_00000008;
  in_RDI[7]._vptr_IEventReceiver = (_func_int **)in_stack_00000008[1];
  in_RDI[8]._vptr_IEventReceiver = (_func_int **)*in_stack_00000008;
  in_RDI[9]._vptr_IEventReceiver = (_func_int **)in_stack_00000008[1];
  in_RDI[10]._vptr_IEventReceiver = (_func_int **)*in_stack_00000008;
  in_RDI[0xb]._vptr_IEventReceiver = (_func_int **)in_stack_00000008[1];
  in_RDI[0xc]._vptr_IEventReceiver = (_func_int **)*in_stack_00000008;
  in_RDI[0xd]._vptr_IEventReceiver = (_func_int **)in_stack_00000008[1];
  core::rect<int>::rect((rect<int> *)in_RSI);
  core::rect<float>::rect(in_RSI);
  local_3c[3] = 0;
  local_3c[2] = 0;
  core::dimension2d<unsigned_int>::dimension2d
            ((dimension2d<unsigned_int> *)(in_RDI + 0x12),local_3c + 3,local_3c + 2);
  local_3c[1] = 1;
  local_3c[0] = 1;
  core::dimension2d<unsigned_int>::dimension2d
            ((dimension2d<unsigned_int> *)(in_RDI + 0x13),local_3c + 1,local_3c);
  *(undefined1 *)&in_RDI[0x14]._vptr_IEventReceiver = 1;
  *(undefined1 *)((long)&in_RDI[0x14]._vptr_IEventReceiver + 1) = 1;
  *(undefined1 *)((long)&in_RDI[0x14]._vptr_IEventReceiver + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x14]._vptr_IEventReceiver + 3) = 0;
  core::string<wchar_t>::string((string<wchar_t> *)0x39e60f);
  core::string<wchar_t>::string((string<wchar_t> *)0x39e620);
  core::string<char>::string((string<char> *)0x39e631);
  *(uint *)&in_RDI[0x21]._vptr_IEventReceiver = local_3c[4];
  *(undefined1 *)((long)&in_RDI[0x21]._vptr_IEventReceiver + 4) = 0;
  *(undefined4 *)&in_RDI[0x22]._vptr_IEventReceiver = 0xffffffff;
  *(undefined1 *)((long)&in_RDI[0x22]._vptr_IEventReceiver + 4) = 0;
  *(undefined4 *)&in_RDI[0x23]._vptr_IEventReceiver = 0;
  *(undefined4 *)((long)&in_RDI[0x23]._vptr_IEventReceiver + 4) = 0;
  *(undefined4 *)&in_RDI[0x24]._vptr_IEventReceiver = 0;
  *(undefined4 *)((long)&in_RDI[0x24]._vptr_IEventReceiver + 4) = 0;
  in_RDI[0x25]._vptr_IEventReceiver = (_func_int **)in_RCX;
  *(undefined4 *)&in_RDI[0x26]._vptr_IEventReceiver = in_EDX;
  if (in_R8 != (IGUIElement *)0x0) {
    addChildToEnd(in_RCX,in_R8);
    recalculateAbsolutePosition(this,vtt._7_1_);
  }
  return;
}

Assistant:

IGUIElement(EGUI_ELEMENT_TYPE type, IGUIEnvironment *environment, IGUIElement *parent,
			s32 id, const core::rect<s32> &rectangle) :
			Parent(0),
			RelativeRect(rectangle), AbsoluteRect(rectangle),
			AbsoluteClippingRect(rectangle), DesiredRect(rectangle),
			MaxSize(0, 0), MinSize(1, 1), IsVisible(true), IsEnabled(true),
			IsSubElement(false), NoClip(false), ID(id), IsTabStop(false), TabOrder(-1), IsTabGroup(false),
			AlignLeft(EGUIA_UPPERLEFT), AlignRight(EGUIA_UPPERLEFT), AlignTop(EGUIA_UPPERLEFT), AlignBottom(EGUIA_UPPERLEFT),
			Environment(environment), Type(type)
	{
#ifdef _DEBUG
		setDebugName("IGUIElement");
#endif

		// if we were given a parent to attach to
		if (parent) {
			parent->addChildToEnd(this);
			recalculateAbsolutePosition(true);
		}
	}